

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall ccs::anon_unknown_0::StdErrLogger::error(StdErrLogger *this,string *msg)

{
  ostream *poVar1;
  string *msg_local;
  StdErrLogger *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void error(const std::string &msg)
    { std::cerr << "ERROR: " << msg << std::endl; }